

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O1

double Js::JavascriptNumber::DirectPowDoubleInt(double x,int32 y)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  
  if (0x10 < y + 8U) {
    dVar3 = pow(x,(double)y);
    return dVar3;
  }
  uVar2 = (ulong)(uint)-y;
  if (0 < y) {
    uVar2 = (ulong)(uint)y;
  }
  dVar3 = x;
  if ((uVar2 & 1) == 0) {
    dVar3 = 1.0;
  }
  if (1 < (uint)uVar2) {
    do {
      x = x * x;
      if ((uVar2 & 2) != 0) {
        dVar3 = dVar3 * x;
      }
      uVar1 = (uint)uVar2;
      uVar2 = uVar2 >> 1;
    } while (3 < uVar1);
  }
  if (y < 0) {
    dVar3 = 1.0 / dVar3;
  }
  return dVar3;
}

Assistant:

double JavascriptNumber::DirectPowDoubleInt(double x, int32 y)
    {
        // For exponent in [-8, 8], aggregate the product according to binary representation
        // of exponent. This acceleration may lead to significant deviation for larger exponent
        if (y >= -8 && y <= 8)
        {
            uint32 uexp = static_cast<uint32>(y >= 0 ? y : -y);
            for (double result = 1.0; ; x *= x)
            {
                if ((uexp & 1) != 0)
                {
                    result *= x;
                }
                if ((uexp >>= 1) == 0)
                {
                    return (y < 0 ? (1.0 / result) : result);
                }
            }
        }

        // always call pow(double, double) in C runtime which has a bug to process pow(double, int).
        return ::pow(x, static_cast<double>(y));
    }